

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O2

void eltcalc::GetEventRates<occurrence_granular>(occurrence_granular *occ,FILE *fin)

{
  int iVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  int iVar4;
  double dVar5;
  int no_of_periods;
  
  no_of_periods = 0;
  fread(&no_of_periods,4,1,(FILE *)fin);
  sVar2 = fread(occ,0x10,1,(FILE *)fin);
  iVar1 = no_of_periods;
  dVar5 = (double)no_of_periods;
  iVar4 = 0;
  while (sVar2 != 0) {
    pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)event_rate_,&occ->event_id);
    *pmVar3 = *pmVar3 + 1.0 / dVar5;
    if (iVar4 <= occ->period_no) {
      iVar4 = occ->period_no;
    }
    sVar2 = fread(occ,0x10,1,(FILE *)fin);
  }
  fclose((FILE *)fin);
  if (iVar4 <= iVar1) {
    return;
  }
  fwrite("FATAL: Maximum period number in occurrence file exceeds that in header.\n",0x48,1,_stderr)
  ;
  exit(1);
}

Assistant:

void GetEventRates(T &occ, FILE * fin)
	{
		// Calculate event rates from occurrence file
		int max_period_no = 0;
		int no_of_periods = 0;
		size_t i = fread(&no_of_periods, sizeof(no_of_periods), 1, fin);
		i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			event_rate_[occ.event_id] += 1 / (double)no_of_periods;
			if (max_period_no < occ.period_no)
				max_period_no = occ.period_no;
			i = fread(&occ, sizeof(occ), 1, fin);
		}
		fclose(fin);

		if (max_period_no > no_of_periods) {
			fprintf(stderr, "FATAL: Maximum period number in occurrence file exceeds that in header.\n");
			exit(EXIT_FAILURE);
		}
	}